

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O2

int coda_ascbin_cursor_goto_available_union_field(coda_cursor *cursor)

{
  int iVar1;
  long in_RAX;
  coda_type *pcVar2;
  long index;
  
  pcVar2 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar2->format) {
    pcVar2 = *(coda_type **)&pcVar2->type_class;
  }
  if (pcVar2[1].attributes == (coda_type_record *)0x0) {
    coda_set_error(-0x69,"cursor does not refer to a union");
  }
  else {
    index = in_RAX;
    iVar1 = coda_ascbin_cursor_get_available_union_field_index(cursor,&index);
    if (iVar1 == 0) {
      iVar1 = cursor->n;
      cursor->n = iVar1 + 1;
      cursor->stack[iVar1].type =
           *(coda_dynamic_type_struct **)(*(long *)(pcVar2[1].description + index * 8) + 0x10);
      cursor->stack[iVar1].index = index;
      cursor->stack[iVar1].bit_offset = cursor->stack[(long)iVar1 + -1].bit_offset;
      return 0;
    }
  }
  return -1;
}

Assistant:

int coda_ascbin_cursor_goto_available_union_field(coda_cursor *cursor)
{
    coda_type_record *record;
    long index;

    record = (coda_type_record *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (record->union_field_expr == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to a union");
        return -1;
    }

    if (coda_ascbin_cursor_get_available_union_field_index(cursor, &index) != 0)
    {
        return -1;
    }

    cursor->n++;
    cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)record->field[index]->type;
    cursor->stack[cursor->n - 1].index = index;
    cursor->stack[cursor->n - 1].bit_offset = cursor->stack[cursor->n - 2].bit_offset;

    return 0;
}